

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-backend-reg.cpp
# Opt level: O0

ggml_backend_reg_t ggml_backend_reg_by_name(char *name)

{
  bool bVar1;
  char *pcVar2;
  ggml_backend_reg_t reg;
  size_t i;
  ggml_backend_reg_t in_stack_ffffffffffffffe0;
  char *pcVar3;
  char *a;
  
  pcVar3 = (char *)0x0;
  while( true ) {
    a = pcVar3;
    pcVar2 = (char *)ggml_backend_reg_count();
    if (pcVar2 <= pcVar3) {
      return (ggml_backend_reg_t)0x0;
    }
    in_stack_ffffffffffffffe0 = ggml_backend_reg_get((size_t)in_stack_ffffffffffffffe0);
    ggml_backend_reg_name(in_stack_ffffffffffffffe0);
    bVar1 = striequals(a,(char *)in_stack_ffffffffffffffe0);
    if (bVar1) break;
    pcVar3 = a + 1;
  }
  return in_stack_ffffffffffffffe0;
}

Assistant:

ggml_backend_reg_t ggml_backend_reg_by_name(const char * name) {
    for (size_t i = 0; i < ggml_backend_reg_count(); i++) {
        ggml_backend_reg_t reg = ggml_backend_reg_get(i);
        if (striequals(ggml_backend_reg_name(reg), name)) {
            return reg;
        }
    }
    return nullptr;
}